

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatement(cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmLocalNinjaGenerator *pcVar3;
  cmMakefile *this_00;
  cmGeneratorTarget *target;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  pointer pbVar11;
  size_type sVar12;
  pointer pbVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  string *psVar18;
  char *pcVar19;
  mapped_type *pmVar20;
  long *plVar21;
  mapped_type *defines;
  mapped_type *includes;
  size_t sVar22;
  MapToNinjaPathImpl MVar23;
  cmCustomCommand *pcVar24;
  cmGlobalNinjaGenerator *pcVar25;
  iterator iVar26;
  mapped_type *this_01;
  cmGlobalNinjaGenerator *pcVar27;
  size_type *psVar28;
  uint uVar29;
  undefined8 uVar30;
  _Alloc_hider _Var31;
  cmNinjaTargetGenerator *pcVar32;
  string *odi;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  string ppFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string language;
  string repVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_340;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_328;
  _Alloc_hider local_2f8;
  pointer local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string objectFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  string cmakeLinkVar;
  string cmakeVarLang;
  string sourceFileName;
  string objectFileDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceDirectory;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  cmNinjaBuild objBuild;
  key_type local_d0;
  key_type local_b0;
  string local_90;
  string local_70;
  string objectDir;
  
  pcVar32 = (cmNinjaTargetGenerator *)&__str_1;
  cmSourceFile::GetLanguage_abi_cxx11_(&language,source);
  iVar16 = std::__cxx11::string::compare((char *)&language);
  if (iVar16 == 0) {
    psVar18 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    sourceFileName._M_dataplus._M_p = (pointer)&sourceFileName.field_2;
    pcVar2 = (psVar18->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sourceFileName,pcVar2,pcVar2 + psVar18->_M_string_length);
  }
  else {
    psVar18 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    ConvertToNinjaPath(&sourceFileName,this,psVar18);
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objBuild.Comment,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  ConvertToNinjaPath(&objectDir,this,&objBuild.Comment);
  paVar1 = &objBuild.Comment.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objBuild.Comment._M_dataplus._M_p != paVar1) {
    operator_delete(objBuild.Comment._M_dataplus._M_p,
                    CONCAT71(objBuild.Comment.field_2._M_allocated_capacity._1_7_,
                             objBuild.Comment.field_2._M_local_buf[0]) + 1);
  }
  GetObjectFilePath_abi_cxx11_(&objBuild.Comment,this,source);
  ConvertToNinjaPath(&objectFileName,this,&objBuild.Comment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objBuild.Comment._M_dataplus._M_p != paVar1) {
    operator_delete(objBuild.Comment._M_dataplus._M_p,
                    CONCAT71(objBuild.Comment.field_2._M_allocated_capacity._1_7_,
                             objBuild.Comment.field_2._M_local_buf[0]) + 1);
  }
  cmsys::SystemTools::GetFilenamePath(&objectFileDir,&objectFileName);
  cmakeVarLang._M_dataplus._M_p = (pointer)&cmakeVarLang.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakeVarLang,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&cmakeVarLang,(ulong)language._M_dataplus._M_p);
  cmakeLinkVar._M_dataplus._M_p = (pointer)&cmakeLinkVar.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cmakeLinkVar,cmakeVarLang._M_dataplus._M_p,
             cmakeVarLang._M_dataplus._M_p + cmakeVarLang._M_string_length);
  std::__cxx11::string::append((char *)&cmakeLinkVar);
  pcVar19 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&cmakeLinkVar);
  iVar16 = std::__cxx11::string::compare((char *)&language);
  if ((iVar16 == 0) ||
     ((iVar16 = std::__cxx11::string::compare((char *)&language), pcVar19 == (char *)0x0 &&
      (iVar16 == 0)))) {
    uVar29 = 0;
  }
  else {
    bVar14 = ForceResponseFile(this);
    uVar29 = (uint)bVar14;
  }
  LanguageCompilerRule(&local_70,this,&language);
  objBuild.Rule._M_dataplus._M_p = (pointer)&objBuild.Rule.field_2;
  objBuild.Comment._M_string_length = 0;
  objBuild.Comment.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    objBuild.Rule.field_2._8_8_ = local_70.field_2._8_8_;
  }
  else {
    objBuild.Rule._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  objBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &objBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header;
  objBuild.Rule._M_string_length = local_70._M_string_length;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  objBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  objBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  objBuild.Outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objBuild.Outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objBuild.Outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objBuild.ImplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objBuild.ImplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objBuild.ImplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objBuild.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objBuild.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objBuild.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objBuild.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objBuild.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objBuild.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objBuild.OrderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objBuild.OrderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objBuild.OrderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  objBuild.RspFile._M_dataplus._M_p = (pointer)&objBuild.RspFile.field_2;
  objBuild.RspFile._M_string_length = 0;
  objBuild.RspFile.field_2._M_local_buf[0] = '\0';
  objBuild.Comment._M_dataplus._M_p = (pointer)paVar1;
  objBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       objBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ComputeFlagsForObject(&repVar,this,source,&language);
  paVar1 = &__str_2.field_2;
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&objBuild.Variables,&__str_2);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  ComputeDefines(&repVar,this,source,&language);
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"DEFINES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&objBuild.Variables,&__str_2);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  ComputeIncludes(&repVar,this,source,&language);
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"INCLUDES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&objBuild.Variables,&__str_2);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  bVar14 = NeedDepTypeMSVC(this,&language);
  if (!bVar14) {
    if (language._M_string_length == 0) {
LAB_00334c2d:
      pcVar3 = this->LocalGenerator;
      __str_2._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_2,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&__str_2);
      cmOutputConverter::ConvertToOutputFormat
                (&repVar,&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,&__str_2,SHELL);
      ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppFileName,"DEP_FILE","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&objBuild.Variables,&ppFileName);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&repVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
        operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)repVar._M_dataplus._M_p != &repVar.field_2) {
        operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
      }
      uVar30 = __str_2.field_2._M_allocated_capacity;
      _Var31._M_p = __str_2._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p == paVar1) goto LAB_00334ec0;
    }
    else {
      repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,"CMAKE_","");
      std::__cxx11::string::_M_append((char *)&repVar,(ulong)language._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&repVar);
      bVar14 = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&repVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)repVar._M_dataplus._M_p != &repVar.field_2) {
        operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
      }
      if (!bVar14) goto LAB_00334c2d;
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&__str_2,&objectFileName);
      plVar21 = (long *)std::__cxx11::string::append((char *)&__str_2);
      repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
      psVar28 = (size_type *)(plVar21 + 2);
      if ((size_type *)*plVar21 == psVar28) {
        repVar.field_2._M_allocated_capacity = *psVar28;
        repVar.field_2._8_8_ = plVar21[3];
      }
      else {
        repVar.field_2._M_allocated_capacity = *psVar28;
        repVar._M_dataplus._M_p = (pointer)*plVar21;
      }
      repVar._M_string_length = plVar21[1];
      *plVar21 = (long)psVar28;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar1) {
        operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = this->LocalGenerator;
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_1,objectFileDir._M_dataplus._M_p,
                 objectFileDir._M_dataplus._M_p + objectFileDir._M_string_length);
      std::__cxx11::string::append((char *)&__str_1);
      plVar21 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&__str_1,(ulong)repVar._M_dataplus._M_p);
      psVar28 = (size_type *)(plVar21 + 2);
      if ((size_type *)*plVar21 == psVar28) {
        ppFileName.field_2._M_allocated_capacity = *psVar28;
        ppFileName.field_2._8_8_ = plVar21[3];
        ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
      }
      else {
        ppFileName.field_2._M_allocated_capacity = *psVar28;
        ppFileName._M_dataplus._M_p = (pointer)*plVar21;
      }
      ppFileName._M_string_length = plVar21[1];
      *plVar21 = (long)psVar28;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      cmOutputConverter::ConvertToOutputFormat
                (&__str_2,&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           super_cmOutputConverter,&ppFileName,SHELL);
      __str_5._M_dataplus._M_p = (pointer)&__str_5.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"DEP_FILE","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&objBuild.Variables,&__str_5);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&__str_2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != &__str_5.field_2) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar1) {
        operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
        operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      uVar30 = repVar.field_2._M_allocated_capacity;
      _Var31._M_p = repVar._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)repVar._M_dataplus._M_p == &repVar.field_2) goto LAB_00334ec0;
    }
    operator_delete(_Var31._M_p,uVar30 + 1);
  }
LAB_00334ec0:
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,"FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&objBuild.Variables,&repVar);
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"DEFINES","");
  defines = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&objBuild.Variables,&__str_2);
  ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppFileName,"INCLUDES","");
  includes = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&objBuild.Variables,&ppFileName);
  ExportObjectCompileCommand
            (this,&language,&sourceFileName,&objectDir,&objectFileName,&objectFileDir,pmVar20,
             defines,includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
    operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&objBuild.Outputs,&objectFileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Objects,&objectFileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&objBuild.ExplicitDeps,&sourceFileName);
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,"OBJECT_DEPENDS","");
  pcVar19 = cmSourceFile::GetProperty(source,&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  if (pcVar19 != (char *)0x0) {
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    sVar22 = strlen(pcVar19);
    std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,pcVar19,pcVar19 + sVar22);
    cmSystemTools::ExpandedListArgument
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__str_2,&repVar,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repVar._M_dataplus._M_p != &repVar.field_2) {
      operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
    }
    sVar12 = __str_2._M_string_length;
    if (__str_2._M_dataplus._M_p != (pointer)__str_2._M_string_length) {
      _Var31._M_p = __str_2._M_dataplus._M_p;
      do {
        bVar14 = cmsys::SystemTools::FileIsFullPath((string *)_Var31._M_p);
        if (bVar14) {
          cmsys::SystemTools::CollapseFullPath(&repVar,(string *)_Var31._M_p);
          std::__cxx11::string::operator=((string *)_Var31._M_p,(string *)&repVar);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)repVar._M_dataplus._M_p != &repVar.field_2) {
            operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
          }
        }
        _Var31._M_p = _Var31._M_p + 0x20;
      } while (_Var31._M_p != (pointer)sVar12);
    }
    _Var31._M_p = __str_2._M_dataplus._M_p;
    MVar23.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Var31._M_p,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__str_2._M_string_length,
               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )&objBuild.ImplicitDeps,MVar23);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str_2);
  }
  OrderDependsTargetForTarget_abi_cxx11_(&repVar,this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &objBuild.OrderOnlyDeps,&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  bVar14 = source->IsGenerated;
  if (bVar14 == true) {
    __str_2._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__str_2,"__CMAKE_GENERATED_BY_CMAKE","");
    bVar15 = cmSourceFile::GetPropertyAsBool(source,&__str_2);
    if ((!bVar15) &&
       (pcVar24 = cmSourceFile::GetCustomCommand(source), pcVar24 == (cmCustomCommand *)0x0)) {
      pcVar25 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      iVar26 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pcVar25->CustomCommandOutputs)._M_t,&sourceFileName);
      bVar15 = (_Rb_tree_header *)iVar26._M_node ==
               &(pcVar25->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
      goto LAB_0033523b;
    }
  }
  bVar15 = false;
LAB_0033523b:
  if ((bVar14 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1)) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if (bVar15) {
    pcVar25 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddAssumedSourceDependencies
              (pcVar25,&sourceFileName,&objBuild.OrderOnlyDeps);
  }
  iVar16 = std::__cxx11::string::compare((char *)&language);
  iVar17 = std::__cxx11::string::compare((char *)&language);
  if (iVar17 == 0) {
    LanguagePreprocessRule(&local_90,this,&language);
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    repVar._M_string_length = 0;
    repVar.field_2._M_allocated_capacity = repVar.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_328._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_370.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_370.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_370.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_340.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_340.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2f8._M_p = (pointer)&local_2e8;
    local_2f0 = (pointer)0x0;
    local_2e8._M_local_buf[0] = '\0';
    local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    GetPreprocessedFilePath_abi_cxx11_(&__str_1,this,source);
    ConvertToNinjaPath(&ppFileName,this,&__str_1);
    paVar1 = &__str_1.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_3a0,&ppFileName);
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_1,ppFileName._M_dataplus._M_p,
               ppFileName._M_dataplus._M_p + ppFileName._M_string_length);
    std::__cxx11::string::append((char *)&__str_1);
    std::__cxx11::string::operator=((string *)&local_2f8,(string *)&__str_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    iVar17 = std::__cxx11::string::compare((char *)&language);
    pbVar13 = local_340.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar17 == 0) {
      pbVar4 = objBuild.ExplicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = objBuild.ExplicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar6 = objBuild.ExplicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      p_Var7 = (_Base_ptr)
               objBuild.ImplicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      objBuild.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_370.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      objBuild.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_370.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      objBuild.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_370.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      objBuild.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           vStack_358.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      p_Var8 = (_Base_ptr)
               objBuild.ImplicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      p_Var9 = (_Base_ptr)
               objBuild.ImplicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      objBuild.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_358.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      objBuild.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_358.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      p_Var10 = (_Base_ptr)
                objBuild.OrderOnlyDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = objBuild.OrderOnlyDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_340.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           objBuild.OrderOnlyDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      objBuild.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_340.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      objBuild.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_340.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      objBuild.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar13;
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      local_370.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar4;
      local_370.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
      local_370.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar6;
      vStack_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var7;
      vStack_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var8;
      vStack_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var9;
      local_340.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var10;
      local_340.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"IN_ABS","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_328,&__str_1);
      __str_5._M_dataplus._M_p = (pointer)&__str_5.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"IN_ABS","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&objBuild.Variables,&__str_5);
      std::__cxx11::string::swap((string *)pmVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != &__str_5.field_2) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&objBuild.ExplicitDeps,&ppFileName);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_370,&objBuild.ExplicitDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&vStack_358,&objBuild.ImplicitDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_340,&objBuild.OrderOnlyDeps);
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"IN_ABS","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&objBuild.Variables,&__str_1);
      __str_5._M_dataplus._M_p = (pointer)&__str_5.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"IN_ABS","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_328,&__str_5);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != &__str_5.field_2) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"FLAGS","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&objBuild.Variables,&__str_1);
    paVar33 = &__str_5.field_2;
    __str_5._M_dataplus._M_p = (pointer)paVar33;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_328,&__str_5);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_5._M_dataplus._M_p != paVar33) {
      operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if (iVar17 == 0) {
      this_00 = (this->super_cmCommonTargetGenerator).Makefile;
      std::operator+(&__str_5,"CMAKE_",&language);
      plVar21 = (long *)std::__cxx11::string::append((char *)&__str_5);
      psVar28 = (size_type *)(plVar21 + 2);
      if ((size_type *)*plVar21 == psVar28) {
        __str_1.field_2._M_allocated_capacity = *psVar28;
        __str_1.field_2._8_8_ = plVar21[3];
        __str_1._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        __str_1.field_2._M_allocated_capacity = *psVar28;
        __str_1._M_dataplus._M_p = (pointer)*plVar21;
      }
      __str_1._M_string_length = plVar21[1];
      *plVar21 = (long)psVar28;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      psVar18 = cmMakefile::GetSafeDefinition(this_00,&__str_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != paVar33) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = this->LocalGenerator;
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"FLAGS","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&objBuild.Variables,&__str_1);
      (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar3,pmVar20,psVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"DEFINES","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_328,&__str_1);
      __str_5._M_dataplus._M_p = (pointer)paVar33;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"DEFINES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&objBuild.Variables,&__str_5);
      std::__cxx11::string::swap((string *)pmVar20);
    }
    else {
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"DEFINES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&objBuild.Variables,&__str_1);
      __str_5._M_dataplus._M_p = (pointer)paVar33;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"DEFINES","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_328,&__str_5);
      std::__cxx11::string::_M_assign((string *)pmVar20);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_5._M_dataplus._M_p != paVar33) {
      operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"INCLUDES","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&objBuild.Variables,&__str_1);
    __str_5._M_dataplus._M_p = (pointer)paVar33;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"INCLUDES","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_328,&__str_5);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_5._M_dataplus._M_p != paVar33) {
      operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if (iVar17 == 0) {
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar18 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetParentDirectory(&__str_1,psVar18);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &sourceDirectory,&__str_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      target = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      pcVar3 = this->LocalGenerator;
      psVar18 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                          (&this->super_cmCommonTargetGenerator);
      cmLocalGenerator::GetIncludeFlags
                (&__str_1,(cmLocalGenerator *)pcVar3,&sourceDirectory,target,&language,false,false,
                 psVar18);
      __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_4,__str_1._M_dataplus._M_p,
                 __str_1._M_dataplus._M_p + __str_1._M_string_length);
      std::__cxx11::string::append((char *)&__str_4);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"INCLUDES","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&objBuild.Variables,&local_b0);
      plVar21 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&__str_4,(ulong)(pmVar20->_M_dataplus)._M_p);
      __str_5._M_dataplus._M_p = (pointer)&__str_5.field_2;
      psVar28 = (size_type *)(plVar21 + 2);
      if ((size_type *)*plVar21 == psVar28) {
        __str_5.field_2._M_allocated_capacity = *psVar28;
        __str_5.field_2._8_4_ = (undefined4)plVar21[3];
        __str_5.field_2._12_4_ = *(undefined4 *)((long)plVar21 + 0x1c);
      }
      else {
        __str_5.field_2._M_allocated_capacity = *psVar28;
        __str_5._M_dataplus._M_p = (pointer)*plVar21;
      }
      __str_5._M_string_length = plVar21[1];
      *plVar21 = (long)psVar28;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"INCLUDES","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&objBuild.Variables,&local_d0);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&__str_5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != &__str_5.field_2) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&sourceDirectory);
    }
    paVar33 = &__str_5.field_2;
    pcVar3 = this->LocalGenerator;
    __str_5._M_dataplus._M_p = (pointer)paVar33;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_5,objectFileName._M_dataplus._M_p,
               objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
    std::__cxx11::string::append((char *)&__str_5);
    cmOutputConverter::ConvertToOutputFormat
              (&__str_1,&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,&__str_5,SHELL);
    __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"DEP_FILE","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_328,&__str_4);
    std::__cxx11::string::operator=((string *)pmVar20,(string *)&__str_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
      operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_5._M_dataplus._M_p != paVar33) {
      operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
    }
    if (iVar17 == 0) {
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"DEP_FILE","");
      pVar34 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&objBuild.Variables._M_t,&__str_1);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&objBuild.Variables._M_t,(_Base_ptr)pVar34.first._M_node,
                     (_Base_ptr)pVar34.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
    }
    if (iVar16 == 0) {
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"OBJ_FILE","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_328,&__str_1);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_1,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&__str_1);
      __str_5._M_dataplus._M_p = (pointer)paVar33;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str_5,"DYNDEP_INTERMEDIATE_FILE","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_328,&__str_5);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != paVar33) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&vStack_388,&__str_1);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->DDIFiles,&language);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,&__str_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"JOB_POOL_COMPILE","");
    addPoolNinjaVariable
              (pcVar32,&__str_1,(this->super_cmCommonTargetGenerator).GeneratorTarget,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    pcVar25 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar27 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar25,(ostream *)
                       (pcVar27->BuildFileStream)._M_t.
                       super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                       .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
               (cmNinjaBuild *)&repVar,-uVar29,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
      operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&repVar);
  }
  if (iVar16 == 0) {
    GetDyndepFilePath(&repVar,this,&language);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&objBuild.OrderOnlyDeps,&repVar);
    ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppFileName,"dyndep","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&objBuild.Variables,&ppFileName);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
      operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repVar._M_dataplus._M_p != &repVar.field_2) {
      operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureParentDirectoryExists(this,&objectFileName);
  cmOutputConverter::ConvertToOutputFormat
            (&repVar,&(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,&objectDir,SHELL);
  ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppFileName,"OBJECT_DIR","");
  paVar1 = &repVar.field_2;
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&objBuild.Variables,&ppFileName);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
    operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != paVar1) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  cmOutputConverter::ConvertToOutputFormat
            (&repVar,&(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,&objectFileDir,SHELL);
  ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppFileName,"OBJECT_FILE_DIR","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&objBuild.Variables,&ppFileName);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
    operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != paVar1) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  pcVar32 = (cmNinjaTargetGenerator *)&repVar;
  repVar._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar32,"JOB_POOL_COMPILE","");
  addPoolNinjaVariable
            (pcVar32,&repVar,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             &objBuild.Variables);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != paVar1) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  SetMsvcTargetPdbVariable(this,&objBuild.Variables);
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&repVar,objectFileName._M_dataplus._M_p,
             objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
  std::__cxx11::string::append((char *)&repVar);
  std::__cxx11::string::operator=((string *)&objBuild.RspFile,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  iVar16 = std::__cxx11::string::compare((char *)&language);
  if (iVar16 == 0) {
    EmitSwiftDependencyInfo(this,source);
  }
  else {
    pcVar25 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar27 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar25,(ostream *)
                       (pcVar27->BuildFileStream)._M_t.
                       super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                       .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,&objBuild
               ,-uVar29,(bool *)0x0);
  }
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,"OBJECT_OUTPUTS","");
  pcVar19 = cmSourceFile::GetProperty(source,&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  if (pcVar19 != (char *)0x0) {
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"phony","");
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    repVar._M_string_length = 0;
    repVar.field_2._M_allocated_capacity = repVar.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_328._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1f0 = 0;
    local_1e8[0] = 0;
    local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_370.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_370.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_370.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_340.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_340.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2f8._M_p = (pointer)&local_2e8;
    local_2f0 = (pointer)0x0;
    local_2e8._M_local_buf[0] = '\0';
    local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_328._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_replace((ulong)&repVar,0,(char *)0x0,0x5c3e54);
    ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
    sVar22 = strlen(pcVar19);
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppFileName,pcVar19,pcVar19 + sVar22);
    cmSystemTools::ExpandedListArgument
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__str_5,&ppFileName,false);
    __str_1.field_2._M_allocated_capacity =
         (size_type)
         local_3a0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __str_1._M_string_length =
         (size_type)
         local_3a0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __str_1._M_dataplus._M_p =
         (pointer)local_3a0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)__str_5._M_dataplus._M_p;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)__str_5._M_string_length;
    local_3a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__str_5.field_2._M_allocated_capacity;
    __str_5._M_dataplus._M_p = (pointer)0x0;
    __str_5._M_string_length = 0;
    __str_5.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str_5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
      operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
    }
    pbVar4 = local_3a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar13 = local_3a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar23.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar13,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )pbVar13,MVar23);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_370,&objBuild.Outputs);
    pcVar25 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar27 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar25,(ostream *)
                       (pcVar27->BuildFileStream)._M_t.
                       super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                       .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
               (cmNinjaBuild *)&repVar,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&repVar);
  }
  cmNinjaBuild::~cmNinjaBuild(&objBuild);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeLinkVar._M_dataplus._M_p != &cmakeLinkVar.field_2) {
    operator_delete(cmakeLinkVar._M_dataplus._M_p,cmakeLinkVar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeVarLang._M_dataplus._M_p != &cmakeVarLang.field_2) {
    operator_delete(cmakeVarLang._M_dataplus._M_p,cmakeVarLang.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileDir._M_dataplus._M_p != &objectFileDir.field_2) {
    operator_delete(objectFileDir._M_dataplus._M_p,objectFileDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileName._M_dataplus._M_p != &objectFileName.field_2) {
    operator_delete(objectFileName._M_dataplus._M_p,objectFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceFileName._M_dataplus._M_p != &sourceFileName.field_2) {
    operator_delete(sourceFileName._M_dataplus._M_p,sourceFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatement(
  cmSourceFile const* source)
{
  std::string const language = source->GetLanguage();
  std::string const sourceFileName =
    language == "RC" ? source->GetFullPath() : this->GetSourceFilePath(source);
  std::string const objectDir =
    this->ConvertToNinjaPath(this->GeneratorTarget->GetSupportDirectory());
  std::string const objectFileName =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source));
  std::string const objectFileDir =
    cmSystemTools::GetFilenamePath(objectFileName);

  std::string cmakeVarLang = "CMAKE_";
  cmakeVarLang += language;

  // build response file name
  std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_FLAG";

  const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);

  bool const lang_supports_response =
    !(language == "RC" || (language == "CUDA" && !flag));
  int const commandLineLengthLimit =
    ((lang_supports_response && this->ForceResponseFile())) ? -1 : 0;

  cmNinjaBuild objBuild(this->LanguageCompilerRule(language));
  cmNinjaVars& vars = objBuild.Variables;
  vars["FLAGS"] = this->ComputeFlagsForObject(source, language);
  vars["DEFINES"] = this->ComputeDefines(source, language);
  vars["INCLUDES"] = this->ComputeIncludes(source, language);

  if (!this->NeedDepTypeMSVC(language)) {
    bool replaceExt(false);
    if (!language.empty()) {
      std::string repVar = "CMAKE_";
      repVar += language;
      repVar += "_DEPFILE_EXTENSION_REPLACE";
      replaceExt = this->Makefile->IsOn(repVar);
    }
    if (!replaceExt) {
      // use original code
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileName + ".d", cmOutputConverter::SHELL);
    } else {
      // Replace the original source file extension with the
      // depend file extension.
      std::string dependFileName =
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName) + ".d";
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileDir + "/" + dependFileName, cmOutputConverter::SHELL);
    }
  }

  this->ExportObjectCompileCommand(
    language, sourceFileName, objectDir, objectFileName, objectFileDir,
    vars["FLAGS"], vars["DEFINES"], vars["INCLUDES"]);

  objBuild.Outputs.push_back(objectFileName);
  // Add this object to the list of object files.
  this->Objects.push_back(objectFileName);

  objBuild.ExplicitDeps.push_back(sourceFileName);

  if (const char* objectDeps = source->GetProperty("OBJECT_DEPENDS")) {
    std::vector<std::string> depList =
      cmSystemTools::ExpandedListArgument(objectDeps);
    for (std::string& odi : depList) {
      if (cmSystemTools::FileIsFullPath(odi)) {
        odi = cmSystemTools::CollapseFullPath(odi);
      }
    }
    std::transform(depList.begin(), depList.end(),
                   std::back_inserter(objBuild.ImplicitDeps),
                   MapToNinjaPath());
  }

  objBuild.OrderOnlyDeps.push_back(this->OrderDependsTargetForTarget());

  // If the source file is GENERATED and does not have a custom command
  // (either attached to this source file or another one), assume that one of
  // the target dependencies, OBJECT_DEPENDS or header file custom commands
  // will rebuild the file.
  if (source->GetIsGenerated() &&
      !source->GetPropertyAsBool("__CMAKE_GENERATED_BY_CMAKE") &&
      !source->GetCustomCommand() &&
      !this->GetGlobalGenerator()->HasCustomCommandOutput(sourceFileName)) {
    this->GetGlobalGenerator()->AddAssumedSourceDependencies(
      sourceFileName, objBuild.OrderOnlyDeps);
  }

  // For some cases we need to generate a ninja dyndep file.
  bool const needDyndep = this->NeedDyndep(language);

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(language);
  if (explicitPP) {
    cmNinjaBuild ppBuild(this->LanguagePreprocessRule(language));

    std::string const ppFileName =
      this->ConvertToNinjaPath(this->GetPreprocessedFilePath(source));
    ppBuild.Outputs.push_back(ppFileName);

    ppBuild.RspFile = ppFileName + ".rsp";

    bool const compilePP = this->UsePreprocessedSource(language);
    if (compilePP) {
      // Move compilation dependencies to the preprocessing build statement.
      std::swap(ppBuild.ExplicitDeps, objBuild.ExplicitDeps);
      std::swap(ppBuild.ImplicitDeps, objBuild.ImplicitDeps);
      std::swap(ppBuild.OrderOnlyDeps, objBuild.OrderOnlyDeps);
      std::swap(ppBuild.Variables["IN_ABS"], vars["IN_ABS"]);

      // The actual compilation will now use the preprocessed source.
      objBuild.ExplicitDeps.push_back(ppFileName);
    } else {
      // Copy compilation dependencies to the preprocessing build statement.
      ppBuild.ExplicitDeps = objBuild.ExplicitDeps;
      ppBuild.ImplicitDeps = objBuild.ImplicitDeps;
      ppBuild.OrderOnlyDeps = objBuild.OrderOnlyDeps;
      ppBuild.Variables["IN_ABS"] = vars["IN_ABS"];
    }

    // Preprocessing and compilation generally use the same flags.
    ppBuild.Variables["FLAGS"] = vars["FLAGS"];

    if (compilePP) {
      // In case compilation requires flags that are incompatible with
      // preprocessing, include them here.
      std::string const& postFlag = this->Makefile->GetSafeDefinition(
        "CMAKE_" + language + "_POSTPROCESS_FLAG");
      this->LocalGenerator->AppendFlags(vars["FLAGS"], postFlag);
    }

    if (compilePP) {
      // Move preprocessor definitions to the preprocessor build statement.
      std::swap(ppBuild.Variables["DEFINES"], vars["DEFINES"]);
    } else {
      // Copy preprocessor definitions to the preprocessor build statement.
      ppBuild.Variables["DEFINES"] = vars["DEFINES"];
    }

    // Copy include directories to the preprocessor build statement.  The
    // Fortran compilation build statement still needs them for the INCLUDE
    // directive.
    ppBuild.Variables["INCLUDES"] = vars["INCLUDES"];

    if (compilePP) {
      // Prepend source file's original directory as an include directory
      // so e.g. Fortran INCLUDE statements can look for files in it.
      std::vector<std::string> sourceDirectory;
      sourceDirectory.push_back(
        cmSystemTools::GetParentDirectory(source->GetFullPath()));

      std::string sourceDirectoryFlag = this->LocalGenerator->GetIncludeFlags(
        sourceDirectory, this->GeneratorTarget, language, false, false,
        this->GetConfigName());

      vars["INCLUDES"] = sourceDirectoryFlag + " " + vars["INCLUDES"];
    }

    // Explicit preprocessing always uses a depfile.
    ppBuild.Variables["DEP_FILE"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileName + ".pp.d", cmOutputConverter::SHELL);
    if (compilePP) {
      // The actual compilation does not need a depfile because it
      // depends on the already-preprocessed source.
      vars.erase("DEP_FILE");
    }

    if (needDyndep) {
      // Tell dependency scanner the object file that will result from
      // compiling the source.
      ppBuild.Variables["OBJ_FILE"] = objectFileName;

      // Tell dependency scanner where to store dyndep intermediate results.
      std::string const ddiFile = objectFileName + ".ddi";
      ppBuild.Variables["DYNDEP_INTERMEDIATE_FILE"] = ddiFile;
      ppBuild.ImplicitOuts.push_back(ddiFile);
      this->DDIFiles[language].push_back(ddiFile);
    }

    this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                               ppBuild.Variables);

    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), ppBuild,
                                           commandLineLengthLimit);
  }
  if (needDyndep) {
    std::string const dyndep = this->GetDyndepFilePath(language);
    objBuild.OrderOnlyDeps.push_back(dyndep);
    vars["dyndep"] = dyndep;
  }

  EnsureParentDirectoryExists(objectFileName);

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectDir, cmOutputConverter::SHELL);
  vars["OBJECT_FILE_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectFileDir, cmOutputConverter::SHELL);

  this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                             vars);

  this->SetMsvcTargetPdbVariable(vars);

  objBuild.RspFile = objectFileName + ".rsp";

  if (language == "Swift") {
    this->EmitSwiftDependencyInfo(source);
  } else {
    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(),
                                           objBuild, commandLineLengthLimit);
  }

  if (const char* objectOutputs = source->GetProperty("OBJECT_OUTPUTS")) {
    cmNinjaBuild build("phony");
    build.Comment = "Additional output files.";
    build.Outputs = cmSystemTools::ExpandedListArgument(objectOutputs);
    std::transform(build.Outputs.begin(), build.Outputs.end(),
                   build.Outputs.begin(), MapToNinjaPath());
    build.ExplicitDeps = objBuild.Outputs;
    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), build);
  }
}